

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O1

EStatusCode __thiscall
ShadingWriter::WriteAlphaSoftMaskExtGStateObject
          (ShadingWriter *this,PDFRectangle *inBounds,PDFMatrix *inMatrix,
          ObjectIDType inAlphaShadingPatternObjectId,ObjectIDType inExtGStateObjectId)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EStatusCode EVar2;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inObjectReference;
  DictionaryContext *this_01;
  DictionaryContext *this_02;
  string local_60;
  PDFMatrix *local_40;
  ObjectIDType local_38;
  
  this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
  EVar2 = ObjectsContext::StartNewIndirectObject(this->mObjectsContext,inExtGStateObjectId);
  if (EVar2 == eSuccess) {
    local_40 = inMatrix;
    local_38 = inAlphaShadingPatternObjectId;
    this_01 = ObjectsContext::StartDictionary(this->mObjectsContext);
    paVar1 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Type","");
    DictionaryContext::WriteKey(this_01,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"ExtGState","");
    DictionaryContext::WriteNameValue(this_01,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"SMask","");
    DictionaryContext::WriteKey(this_01,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    this_02 = ObjectsContext::StartDictionary(this->mObjectsContext);
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Type","");
    DictionaryContext::WriteKey(this_02,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Mask","");
    DictionaryContext::WriteNameValue(this_02,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"S","");
    DictionaryContext::WriteKey(this_02,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Luminosity","");
    DictionaryContext::WriteNameValue(this_02,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"G","");
    DictionaryContext::WriteKey(this_02,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    DictionaryContext::WriteNewObjectReferenceValue(this_02,inObjectReference);
    EVar2 = ObjectsContext::EndDictionary(this->mObjectsContext,this_02);
    if (EVar2 == eSuccess) {
      EVar2 = ObjectsContext::EndDictionary(this->mObjectsContext,this_01);
      if (EVar2 == eSuccess) {
        ObjectsContext::EndIndirectObject(this->mObjectsContext);
        EVar2 = WriteAlphaSoftMaskXObjectFormObject
                          (this,inBounds,local_40,local_38,inObjectReference);
      }
    }
  }
  return EVar2;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteAlphaSoftMaskExtGStateObject(
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inAlphaShadingPatternObjectId,
    ObjectIDType inExtGStateObjectId
) {
    EStatusCode status = eSuccess;

    do {
        ObjectIDType smaskFormObjectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

        // write ExtGState with soft mask reference
        status = mObjectsContext->StartNewIndirectObject(inExtGStateObjectId);
        if(status != eSuccess)
            break;
        DictionaryContext* extGStateDict = mObjectsContext->StartDictionary();

        extGStateDict->WriteKey("Type");
        extGStateDict->WriteNameValue("ExtGState");
        extGStateDict->WriteKey("SMask");
        DictionaryContext* smaskDict = mObjectsContext->StartDictionary();
        
        smaskDict->WriteKey("Type");
        smaskDict->WriteNameValue("Mask");
        smaskDict->WriteKey("S");
        smaskDict->WriteNameValue("Luminosity");
        smaskDict->WriteKey("G");
        smaskDict->WriteNewObjectReferenceValue(smaskFormObjectId);
        status = mObjectsContext->EndDictionary(smaskDict);
        if(status != eSuccess)
            break;
        status = mObjectsContext->EndDictionary(extGStateDict);
        if(status != eSuccess)
            break;
        mObjectsContext->EndIndirectObject();

        status = WriteAlphaSoftMaskXObjectFormObject(
            inBounds,
            inMatrix,
            inAlphaShadingPatternObjectId,
            smaskFormObjectId  
        );

    } while(false);

    return status;    
}